

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

sexp_conflict
sexp_hash_table_cell
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict ht,sexp_conflict obj,
          sexp_conflict createp)

{
  ulong uVar1;
  sexp_conflict psVar2;
  sexp_conflict psVar3;
  sexp_conflict psVar4;
  undefined8 uVar5;
  int *piVar6;
  ulong uVar7;
  ulong uVar8;
  sexp_conflict buckets;
  long lVar9;
  sexp_conflict local_80;
  sexp_conflict local_78;
  sexp_conflict local_70;
  sexp_conflict local_68;
  sexp_conflict newbuckets;
  ulong local_58;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  
  if (((ulong)ht & 3) == 0) {
    buckets = (ht->value).type.name;
    psVar2 = (ht->value).type.slots;
    psVar4 = (ht->value).type.getters;
    local_68 = createp;
    psVar3 = sexp_get_bucket(ctx,buckets,psVar2,obj);
    lVar9 = (long)psVar3 >> 1;
    local_80 = sexp_scan_bucket(ctx,*(sexp_conflict *)((long)&buckets->value + lVar9 * 8 + 8),obj,
                                psVar4);
    if (local_80 == (sexp_conflict)0x3e) {
      if (local_68 == (sexp_conflict)0x3e) {
        local_80 = (sexp_conflict)0x3e;
      }
      else {
        local_50.var = &local_80;
        local_50.next = (ctx->value).context.saves;
        (ctx->value).context.saves = &local_50;
        uVar7 = (ht->value).fileno.fd;
        uVar1 = (buckets->value).stack.length;
        local_70 = obj;
        if (uVar1 >> 2 < (ulong)(((long)uVar7 >> 1) * 3)) {
          local_40.var = &newbuckets;
          newbuckets = (sexp_conflict)0x43e;
          (ctx->value).context.saves = &local_40;
          local_78 = ht;
          local_58 = uVar7;
          local_40.next = &local_50;
          psVar4 = (sexp_conflict)sexp_make_vector_op(ctx,0,2,(long)((int)uVar1 * 2) * 2 + 1,0x23e);
          newbuckets = psVar4;
          if ((psVar4 != (sexp_conflict)0x0) &&
             ((((ulong)psVar4 & 3) != 0 || (psVar4->tag != 0x13)))) {
            uVar8 = 0;
            uVar7 = uVar1 & 0xffffffff;
            if ((int)uVar1 < 1) {
              uVar7 = uVar8;
            }
            for (; uVar8 != uVar7; uVar8 = uVar8 + 1) {
              for (piVar6 = (int *)((long)&buckets->value + uVar8 * 8 + 8);
                  (piVar6 = *(int **)piVar6, ((ulong)piVar6 & 3) == 0 && (*piVar6 == 6));
                  piVar6 = piVar6 + 4) {
                psVar3 = sexp_get_bucket(ctx,newbuckets,psVar2,
                                         *(sexp_conflict *)(*(long *)(piVar6 + 2) + 8));
                sexp_push_op(ctx,(long)&psVar4->value + (long)(int)((ulong)psVar3 >> 1) * 8 + 8,
                             *(undefined8 *)(piVar6 + 2));
              }
            }
            (local_78->value).type.name = newbuckets;
          }
          obj = local_70;
          ht = local_78;
          (ctx->value).context.saves = local_40.next;
          buckets = (local_78->value).type.name;
          psVar2 = sexp_get_bucket(ctx,buckets,psVar2,local_70);
          lVar9 = (long)psVar2 >> 1;
          uVar7 = local_58;
        }
        local_80 = (sexp_conflict)sexp_cons_op(ctx,0,2,obj,local_68);
        uVar5 = sexp_cons_op(ctx,0,2,local_80,*(undefined8 *)((long)&buckets->value + lVar9 * 8 + 8)
                            );
        *(undefined8 *)((long)&buckets->value + lVar9 * 8 + 8) = uVar5;
        (ht->value).type.cpl = (sexp)((uVar7 | 1) + 2);
        (ctx->value).context.saves = local_50.next;
      }
    }
    else {
      local_80 = (sexp_conflict)(local_80->value).flonum;
    }
    return local_80;
  }
  psVar2 = (sexp_conflict)sexp_xtype_exception(ctx,self,"not a Hash-Table",ht);
  return psVar2;
}

Assistant:

sexp sexp_hash_table_cell (sexp ctx, sexp self, sexp_sint_t n, sexp ht, sexp obj, sexp createp) {
  sexp buckets, eq_fn, hash_fn, i;
  sexp_uint_t size;
  sexp_gc_var1(res);
  /* extra check - exact type should be checked by the calling procedure */
  if (! sexp_pointerp(ht))
    return sexp_xtype_exception(ctx, self, "not a Hash-Table", ht);
  buckets = sexp_hash_table_buckets(ht);
  eq_fn = sexp_hash_table_eq_fn(ht);
  hash_fn = sexp_hash_table_hash_fn(ht);
  i = sexp_get_bucket(ctx, buckets, hash_fn, obj);
  res = sexp_scan_bucket(ctx, sexp_vector_ref(buckets, i), obj, eq_fn);
  if (sexp_truep(res)) {
    res = sexp_car(res);
  } else if (sexp_truep(createp)) {
    sexp_gc_preserve1(ctx, res);
    size = sexp_unbox_fixnum(sexp_hash_table_size(ht));
    if (sexp_hash_resize_check(size, sexp_vector_length(buckets))) {
      sexp_regrow_hash_table(ctx, ht, buckets, hash_fn);
      buckets = sexp_hash_table_buckets(ht);
      i = sexp_get_bucket(ctx, buckets, hash_fn, obj);
    }
    res = sexp_cons(ctx, obj, createp);
    sexp_vector_set(buckets, i, sexp_cons(ctx, res, sexp_vector_ref(buckets, i)));
    sexp_hash_table_size(ht) = sexp_make_fixnum(size+1);
    sexp_gc_release1(ctx);
  }
  return res;
}